

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86.cpp
# Opt level: O0

int __thiscall
ncnn::BatchNorm_x86::forward_inplace(BatchNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  undefined8 *puVar11;
  long *in_RSI;
  long *in_RDI;
  __m128 _p128_2;
  int i_2;
  __m128 _b128_2;
  __m128 _a128_2;
  float b_1;
  float a_1;
  float *ptr_2;
  int q;
  int size_2;
  __m128 _p128_1;
  int j;
  __m128 _b128_1;
  __m128 _a128_1;
  float b;
  float a;
  float *ptr_1;
  int i_1;
  int size_1;
  __m128 _b128;
  __m128 _a128;
  __m128 _p128;
  int i;
  int size;
  float *bptr;
  float *aptr;
  float *ptr;
  int elempack;
  int c;
  int d;
  int h;
  int w;
  int dims;
  Mat *m;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_518;
  undefined8 uStack_510;
  int local_4fc;
  float *local_478;
  int local_470;
  undefined8 local_468;
  undefined8 uStack_460;
  int local_44c;
  float *local_418;
  int local_410;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  int local_3d8;
  float *local_3d0;
  float *local_3c8;
  float *local_3c0;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  
  iVar10 = (int)in_RSI[5];
  iVar3 = *(int *)((long)in_RSI + 0x2c);
  lVar8 = in_RSI[6];
  iVar4 = *(int *)((long)in_RSI + 0x34);
  lVar9 = in_RSI[7];
  iVar5 = (int)in_RSI[3];
  if (iVar10 == 1) {
    local_3c0 = (float *)*in_RSI;
    local_3c8 = *(float **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8);
    local_3d0 = *(float **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240);
    for (local_3d8 = 0; local_3d8 + 3 < iVar3 * iVar5; local_3d8 = local_3d8 + 4) {
      local_e8 = (float)*(undefined8 *)local_3c0;
      fStack_e4 = (float)((ulong)*(undefined8 *)local_3c0 >> 0x20);
      fStack_e0 = (float)*(undefined8 *)(local_3c0 + 2);
      fStack_dc = (float)((ulong)*(undefined8 *)(local_3c0 + 2) >> 0x20);
      local_f8 = (float)*(undefined8 *)local_3d0;
      fStack_f4 = (float)((ulong)*(undefined8 *)local_3d0 >> 0x20);
      fStack_f0 = (float)*(undefined8 *)(local_3d0 + 2);
      fStack_ec = (float)((ulong)*(undefined8 *)(local_3d0 + 2) >> 0x20);
      local_158 = (float)*(undefined8 *)local_3c8;
      fStack_154 = (float)((ulong)*(undefined8 *)local_3c8 >> 0x20);
      fStack_150 = (float)*(undefined8 *)(local_3c8 + 2);
      fStack_14c = (float)((ulong)*(undefined8 *)(local_3c8 + 2) >> 0x20);
      local_3e8 = CONCAT44(fStack_e4 * fStack_f4 + fStack_154,local_e8 * local_f8 + local_158);
      uStack_3e0 = CONCAT44(fStack_dc * fStack_ec + fStack_14c,fStack_e0 * fStack_f0 + fStack_150);
      *(undefined8 *)local_3c0 = local_3e8;
      *(undefined8 *)(local_3c0 + 2) = uStack_3e0;
      local_3c0 = local_3c0 + 4;
      local_3c8 = local_3c8 + 4;
      local_3d0 = local_3d0 + 4;
    }
    for (; local_3d8 < iVar3 * iVar5; local_3d8 = local_3d8 + 1) {
      *local_3c0 = *local_3d0 * *local_3c0 + *local_3c8;
      local_3c0 = local_3c0 + 1;
      local_3c8 = local_3c8 + 1;
      local_3d0 = local_3d0 + 1;
    }
  }
  if (iVar10 == 2) {
    for (local_410 = 0; local_410 < (int)lVar8; local_410 = local_410 + 1) {
      local_418 = (float *)(*in_RSI +
                           (long)*(int *)((long)in_RSI + 0x2c) * (long)local_410 * in_RSI[2]);
      fVar1 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                        (long)local_410 * 4);
      fVar2 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                        (long)local_410 * 4);
      if (iVar5 == 4) {
        puVar11 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                  (long)(local_410 << 2) * 4);
        uVar6 = *puVar11;
        uVar7 = puVar11[1];
        puVar11 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                  (long)(local_410 << 2) * 4);
        local_548 = *puVar11;
        uStack_540 = puVar11[1];
      }
      else {
        uVar6 = CONCAT44(fVar1,fVar1);
        uVar7 = CONCAT44(fVar1,fVar1);
        local_548 = CONCAT44(fVar2,fVar2);
        uStack_540 = CONCAT44(fVar2,fVar2);
      }
      for (local_44c = 0; local_44c + 3 < iVar3 * iVar5; local_44c = local_44c + 4) {
        local_c8 = (float)*(undefined8 *)local_418;
        fStack_c4 = (float)((ulong)*(undefined8 *)local_418 >> 0x20);
        fStack_c0 = (float)*(undefined8 *)(local_418 + 2);
        fStack_bc = (float)((ulong)*(undefined8 *)(local_418 + 2) >> 0x20);
        local_d8 = (float)local_548;
        fStack_d4 = (float)((ulong)local_548 >> 0x20);
        fStack_d0 = (float)uStack_540;
        fStack_cc = (float)((ulong)uStack_540 >> 0x20);
        local_138 = (float)uVar6;
        fStack_134 = (float)((ulong)uVar6 >> 0x20);
        fStack_130 = (float)uVar7;
        fStack_12c = (float)((ulong)uVar7 >> 0x20);
        local_468 = CONCAT44(fStack_c4 * fStack_d4 + fStack_134,local_c8 * local_d8 + local_138);
        uStack_460 = CONCAT44(fStack_bc * fStack_cc + fStack_12c,fStack_c0 * fStack_d0 + fStack_130)
        ;
        *(undefined8 *)local_418 = local_468;
        *(undefined8 *)(local_418 + 2) = uStack_460;
        local_418 = local_418 + 4;
      }
      for (; local_44c < iVar3 * iVar5; local_44c = local_44c + 1) {
        *local_418 = fVar2 * *local_418 + fVar1;
        local_418 = local_418 + 1;
      }
    }
  }
  if ((iVar10 == 3) || (iVar10 == 4)) {
    iVar10 = iVar3 * (int)lVar8 * iVar4 * iVar5;
    for (local_470 = 0; local_470 < (int)lVar9; local_470 = local_470 + 1) {
      local_478 = (float *)(*in_RSI + in_RSI[8] * (long)local_470 * in_RSI[2]);
      fVar1 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                        (long)local_470 * 4);
      fVar2 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                        (long)local_470 * 4);
      if (iVar5 == 4) {
        puVar11 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                  (long)(local_470 << 2) * 4);
        uVar6 = *puVar11;
        uVar7 = puVar11[1];
        puVar11 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                  (long)(local_470 << 2) * 4);
        local_598 = *puVar11;
        uStack_590 = puVar11[1];
      }
      else {
        uVar6 = CONCAT44(fVar1,fVar1);
        uVar7 = CONCAT44(fVar1,fVar1);
        local_598 = CONCAT44(fVar2,fVar2);
        uStack_590 = CONCAT44(fVar2,fVar2);
      }
      for (local_4fc = 0; local_4fc + 3 < iVar10; local_4fc = local_4fc + 4) {
        local_a8 = (float)*(undefined8 *)local_478;
        fStack_a4 = (float)((ulong)*(undefined8 *)local_478 >> 0x20);
        fStack_a0 = (float)*(undefined8 *)(local_478 + 2);
        fStack_9c = (float)((ulong)*(undefined8 *)(local_478 + 2) >> 0x20);
        local_b8 = (float)local_598;
        fStack_b4 = (float)((ulong)local_598 >> 0x20);
        fStack_b0 = (float)uStack_590;
        fStack_ac = (float)((ulong)uStack_590 >> 0x20);
        local_118 = (float)uVar6;
        fStack_114 = (float)((ulong)uVar6 >> 0x20);
        fStack_110 = (float)uVar7;
        fStack_10c = (float)((ulong)uVar7 >> 0x20);
        local_518 = CONCAT44(fStack_a4 * fStack_b4 + fStack_114,local_a8 * local_b8 + local_118);
        uStack_510 = CONCAT44(fStack_9c * fStack_ac + fStack_10c,fStack_a0 * fStack_b0 + fStack_110)
        ;
        *(undefined8 *)local_478 = local_518;
        *(undefined8 *)(local_478 + 2) = uStack_510;
        local_478 = local_478 + 4;
      }
      for (; local_4fc < iVar10; local_4fc = local_4fc + 1) {
        *local_478 = fVar2 * *local_478 + fVar1;
        local_478 = local_478 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}